

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall Js::InterpreterStackFrame::RestoreSp(InterpreterStackFrame *this)

{
  ulong *puVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot RVar4;
  undefined4 *puVar5;
  ulong *puVar6;
  
  puVar6 = *(ulong **)(this + 0x38);
  if (puVar6 == (ulong *)0x0) {
    RVar4 = FunctionBody::GetLocalsCount(*(FunctionBody **)(this + 0x88));
    *(InterpreterStackFrame **)(this + 0x28) = this + (ulong)RVar4 * 8 + 0x160;
    *(InterpreterStackFrame **)(this + 0x30) = this + (ulong)RVar4 * 8 + 0x160;
    *(undefined8 *)(this + 0x38) = 0;
  }
  else {
    if (*(ulong **)(this + 0x30) <= puVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x991,"(m_outSpCached < m_outSp)","m_outSpCached < m_outSp");
      if (!bVar3) goto LAB_00a6b85c;
      *puVar5 = 0;
      puVar6 = *(ulong **)(this + 0x38);
    }
    *(ulong **)(this + 0x30) = puVar6;
    puVar1 = (ulong *)*puVar6;
    *(ulong **)(this + 0x38) = puVar1;
    if (puVar6 < puVar1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x995,"(m_outSpCached == nullptr || m_outSpCached <= m_outSp)",
                                  "m_outSpCached == nullptr || m_outSpCached <= m_outSp");
      if (!bVar3) {
LAB_00a6b85c:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      puVar6 = *(ulong **)(this + 0x30);
    }
    *(ulong *)(this + 0x28) = puVar6[1];
  }
  return;
}

Assistant:

inline void InterpreterStackFrame::RestoreSp()
    {
        // This will be called in the Finally block to restore from the previous SP cached.

        // m_outSpCached can be null if the catch block is called.
        if (m_outSpCached != nullptr)
        {
            Assert(m_outSpCached < m_outSp);
            m_outSp = m_outSpCached;

            m_outSpCached = (Var*)*m_outSp;
            Assert(m_outSpCached == nullptr || m_outSpCached <= m_outSp);

            m_outParams = (Var*)*(m_outSp + 1);
        }
        else
        {
            ResetOut();
        }
    }